

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coreaction.cc
# Opt level: O0

int4 __thiscall ActionExtraPopSetup::apply(ActionExtraPopSetup *this,Funcdata *data)

{
  int4 s;
  int iVar1;
  int4 iVar2;
  undefined4 extraout_var;
  FuncCallSpecs *this_00;
  PcodeOp *pPVar3;
  Address *pc;
  Varnode *pVVar4;
  PcodeOp *pPVar5;
  int local_50;
  int4 i;
  int4 sb_size;
  Address sb_addr;
  VarnodeData *point;
  PcodeOp *op;
  FuncCallSpecs *fc;
  Funcdata *data_local;
  ActionExtraPopSetup *this_local;
  
  if (this->stackspace != (AddrSpace *)0x0) {
    iVar1 = (*this->stackspace->_vptr_AddrSpace[3])(this->stackspace,0);
    sb_addr.offset = CONCAT44(extraout_var,iVar1);
    Address::Address((Address *)&i,*(AddrSpace **)sb_addr.offset,*(uintb *)(sb_addr.offset + 8));
    s = *(int4 *)(sb_addr.offset + 0x10);
    for (local_50 = 0; iVar2 = Funcdata::numCalls(data), local_50 < iVar2; local_50 = local_50 + 1)
    {
      this_00 = Funcdata::getCallSpecs(data,local_50);
      iVar2 = FuncProto::getExtraPop(&this_00->super_FuncProto);
      if (iVar2 != 0) {
        pPVar3 = FuncCallSpecs::getOp(this_00);
        pc = PcodeOp::getAddr(pPVar3);
        pPVar3 = Funcdata::newOp(data,2,pc);
        Funcdata::newVarnodeOut(data,s,(Address *)&i,pPVar3);
        pVVar4 = Funcdata::newVarnode(data,s,(Address *)&i,(Datatype *)0x0);
        Funcdata::opSetInput(data,pPVar3,pVVar4,0);
        iVar2 = FuncProto::getExtraPop(&this_00->super_FuncProto);
        if (iVar2 == 0x8000) {
          Funcdata::opSetOpcode(data,pPVar3,CPUI_INDIRECT);
          pPVar5 = FuncCallSpecs::getOp(this_00);
          pVVar4 = Funcdata::newVarnodeIop(data,pPVar5);
          Funcdata::opSetInput(data,pPVar3,pVVar4,1);
          pPVar5 = FuncCallSpecs::getOp(this_00);
          Funcdata::opInsertBefore(data,pPVar3,pPVar5);
        }
        else {
          iVar2 = FuncProto::getExtraPop(&this_00->super_FuncProto);
          FuncCallSpecs::setEffectiveExtraPop(this_00,iVar2);
          Funcdata::opSetOpcode(data,pPVar3,CPUI_INT_ADD);
          iVar2 = FuncProto::getExtraPop(&this_00->super_FuncProto);
          pVVar4 = Funcdata::newConstant(data,s,(long)iVar2);
          Funcdata::opSetInput(data,pPVar3,pVVar4,1);
          pPVar5 = FuncCallSpecs::getOp(this_00);
          Funcdata::opInsertAfter(data,pPVar3,pPVar5);
        }
      }
    }
  }
  return 0;
}

Assistant:

int4 ActionExtraPopSetup::apply(Funcdata &data)

{
  FuncCallSpecs *fc;
  PcodeOp *op;

  if (stackspace == (AddrSpace *)0) return 0; // No stack to speak of
  const VarnodeData &point(stackspace->getSpacebase(0));
  Address sb_addr(point.space,point.offset);
  int4 sb_size = point.size;
  
  for(int4 i=0;i<data.numCalls();++i) {
    fc = data.getCallSpecs(i);
    if (fc->getExtraPop() == 0) continue; // Stack pointer is undisturbed
    op = data.newOp(2,fc->getOp()->getAddr());
    data.newVarnodeOut(sb_size,sb_addr,op);
    data.opSetInput(op,data.newVarnode(sb_size,sb_addr),0);
    if (fc->getExtraPop() != ProtoModel::extrapop_unknown) { // We know exactly how stack pointer is changed
      fc->setEffectiveExtraPop(fc->getExtraPop());
      data.opSetOpcode(op,CPUI_INT_ADD);
      data.opSetInput(op,data.newConstant(sb_size,fc->getExtraPop()),1);
      data.opInsertAfter(op,fc->getOp());
    }
    else {			// We don't know exactly, so we create INDIRECT
      data.opSetOpcode(op,CPUI_INDIRECT);
      data.opSetInput(op,data.newVarnodeIop(fc->getOp()),1);
      data.opInsertBefore(op,fc->getOp());
    }
  }
  return 0;
}